

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O0

bool __thiscall ProString::operator<(ProString *this,ProString *other)

{
  bool bVar1;
  QStringView *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QStringView *in_stack_ffffffffffffff48;
  QString *str;
  QStringView *in_stack_ffffffffffffff60;
  QStringView *in_stack_ffffffffffffff68;
  QStringView *this_00;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QStringView local_28;
  QString local_18;
  
  local_18.d.size = *(long *)(in_FS_OFFSET + 0x28);
  str = &local_18;
  QStringView::QStringView<QString,_true>(in_stack_ffffffffffffff60,str);
  QStringView::mid(in_stack_ffffffffffffff68,(qsizetype)in_RSI,
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  this_00 = &local_28;
  QStringView::QStringView<QString,_true>(in_RSI,str);
  QStringView::mid(this_00,(qsizetype)in_RSI,
                   CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  bVar1 = ::operator<(in_RDI,in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18.d.size) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const ProString &other) const { return toQStringView() < other.toQStringView(); }